

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefSparse.cpp
# Opt level: O2

string * __thiscall
BeliefSparse::SoftPrint_abi_cxx11_(string *__return_storage_ptr__,BeliefSparse *this)

{
  ostream *poVar1;
  derived_iterator_type *d;
  BScit it;
  stringstream ss;
  undefined1 local_1d8 [24];
  size_type local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar1 = std::operator<<(local_1a8,"[");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"]< ");
  boost::numeric::ublas::
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::begin((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
           *)local_1d8);
  while( true ) {
    boost::numeric::ublas::
    compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::end((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
           *)(local_1d8 + 0x10));
    if (local_1d8._8_8_ == local_1c0) break;
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::operator<<(poVar1,":");
    poVar1 = std::ostream::_M_insert<double>
                       (*(double *)
                         (*(long *)(local_1d8._0_8_ + 0x40) +
                         (local_1d8._8_8_ - *(long *)(local_1d8._0_8_ + 0x28))));
    std::operator<<(poVar1," ");
    local_1d8._8_8_ = local_1d8._8_8_ + 8;
  }
  std::operator<<(local_1a8,">");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

string BeliefSparse::SoftPrint() const
{
#if BeliefSparse_CheckAndAbort
    if(!SanityCheck())
        abort();
#endif
    stringstream ss;
    ss << "[" << _m_b.size() << "]< ";
    for(BScit it=_m_b.begin();
        it!=_m_b.end(); ++it)
        ss << it.index() << ":" << *it << " ";
    ss << ">";
    return(ss.str());
}